

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Renderer *this;
  
  this = (Renderer *)operator_new(0x58);
  Renderer::Renderer(this);
  Renderer::createWindow(this,800,800);
  Renderer::run(this);
  Renderer::~Renderer(this);
  operator_delete(this);
  glfwTerminate();
  return 0;
}

Assistant:

int main() {
	int screenWidth = SWIDTH;
	int screenHeight = SWIDTH;
	// create renderer
	Renderer* renderer = new Renderer();
	// create window
	renderer->createWindow(screenWidth, screenHeight);

	// run main game loop
	renderer->run();

	// deletet renderer
	delete renderer;

	// stop program
	glfwTerminate();
	return 0;
}